

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O3

DdNode * Extra_zddSymmPairsCompute(DdManager *dd,DdNode *bF,DdNode *bVars)

{
  DdNode *pDVar1;
  
  do {
    dd->reordered = 0;
    pDVar1 = extraZddSymmPairsCompute(dd,bF,bVars);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode * Extra_zddSymmPairsCompute( 
  DdManager * dd,   /* the DD manager */
  DdNode * bF,
  DdNode * bVars) 
{
    DdNode * res;
    do {
        dd->reordered = 0;
        res = extraZddSymmPairsCompute( dd, bF, bVars );
    } while (dd->reordered == 1);
    return(res);

}